

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.cc
# Opt level: O2

string_view bloaty::dwarf::AttrValue::ReadBlock<unsigned_short>(string_view *data)

{
  unsigned_short uVar1;
  string_view sVar3;
  string_view sVar2;
  
  uVar1 = ReadFixed<unsigned_short,2ul>(data);
  sVar2 = ReadBytes((ulong)uVar1,data);
  sVar3._M_len = sVar2._M_len;
  sVar3._M_str = sVar2._M_str;
  return sVar3;
}

Assistant:

string_view AttrValue::ReadBlock(string_view* data) {
  D len = ReadFixed<D>(data);
  return ReadBytes(len, data);
}